

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O0

int fits_read_fits_region(fitsfile *fptr,WCSdata *wcs,SAORegion **Rgn,int *status)

{
  shapeType sVar1;
  int iVar2;
  SAORegion *Rgn_00;
  RgnShape *pRVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  int *local_830;
  WCSdata *regwcs;
  RgnShape *newShape;
  SAORegion *aRgn;
  int shapetype [17];
  char local_7c8 [8];
  char shapename [17] [71];
  char local_308 [8];
  char colname [6] [71];
  char comment [73];
  char *cvalue2;
  char *cvalue;
  double *coords;
  double Ypos;
  double Xpos;
  double Ysave;
  double Xsave;
  double Theta;
  double Y;
  double X;
  long icsize [6];
  int local_80;
  int local_7c;
  int tstatus;
  int got_component;
  int dotransform;
  int npos;
  int anynul;
  int idum;
  int icol [6];
  int j;
  int i;
  int *status_local;
  SAORegion **Rgn_local;
  WCSdata *wcs_local;
  fitsfile *fptr_local;
  
  local_7c = 1;
  Ysave = 0.0;
  Xpos = 0.0;
  memcpy(local_308,&DAT_0029f890,0x1aa);
  memcpy(local_7c8,"POINT",0x4b7);
  memcpy(&aRgn,&DAT_0029ff00,0x44);
  local_830 = (int *)0x0;
  if (*status != 0) {
    return *status;
  }
  Rgn_00 = (SAORegion *)malloc(0x58);
  if (Rgn_00 == (SAORegion *)0x0) {
    ffpmsg("Couldn\'t allocate memory to hold Region file contents.");
    *status = 0x71;
    return 0x71;
  }
  Rgn_00->nShapes = 0;
  Rgn_00->Shapes = (RgnShape *)0x0;
  if ((wcs == (WCSdata *)0x0) || (wcs->exists == 0)) {
    (Rgn_00->wcs).exists = 0;
  }
  else {
    memcpy(&Rgn_00->wcs,wcs,0x48);
  }
  local_80 = 0;
  for (icol[5] = 0; icol[5] < 5; icol[5] = icol[5] + 1) {
    ffgcno(fptr,0,colname[(long)icol[5] + -1] + 0x3f,&anynul + icol[5],&local_80);
  }
  if ((local_80 == 0) || (iVar2 = ffmnhd(fptr,2,"REGION",1,status), iVar2 == 0)) {
    iVar2 = ffgky(fptr,0x1f,"NAXIS2",Rgn_00,colname[5] + 0x45,status);
    if (iVar2 == 0) {
      pRVar3 = (RgnShape *)malloc((long)Rgn_00->nShapes * 0xa8);
      Rgn_00->Shapes = pRVar3;
      if (Rgn_00->Shapes == (RgnShape *)0x0) {
        ffpmsg("Failed to allocate memory for Region data");
        *status = 0x71;
      }
      else {
        for (icol[5] = 0; icol[5] < 5; icol[5] = icol[5] + 1) {
          iVar2 = ffgcno(fptr,0,colname[(long)icol[5] + -1] + 0x3f,&anynul + icol[5],status);
          if (iVar2 != 0) {
            ffpmsg("Could not find column.");
            goto LAB_0027a307;
          }
        }
        iVar2 = ffgcno(fptr,0,colname[4] + 0x3f,icol + 3,status);
        if (iVar2 != 0) {
          local_7c = 0;
        }
        tstatus = 0;
        if ((Rgn_00->wcs).exists != 0) {
          local_830 = (int *)malloc(0x48);
          if (local_830 == (int *)0x0) {
            ffpmsg("Failed to allocate memory for Region WCS data");
            *status = 0x71;
            goto LAB_0027a307;
          }
          *local_830 = 1;
          iVar2 = ffgtcs(fptr,anynul,idum,(double *)(local_830 + 2),(double *)(local_830 + 4),
                         (double *)(local_830 + 6),(double *)(local_830 + 8),
                         (double *)(local_830 + 10),(double *)(local_830 + 0xc),
                         (double *)(local_830 + 0xe),(char *)(local_830 + 0x10),status);
          if (iVar2 != 0) {
            *local_830 = 0;
            *status = 0;
          }
          if (((*local_830 != 0) && (wcs->exists != 0)) &&
             ((((1e-06 < ABS(*(double *)(local_830 + 2) - wcs->xrefval) ||
                ((((1e-06 < ABS(*(double *)(local_830 + 4) - wcs->yrefval) ||
                   (1e-06 < ABS(*(double *)(local_830 + 6) - wcs->xrefpix))) ||
                  (1e-06 < ABS(*(double *)(local_830 + 8) - wcs->yrefpix))) ||
                 ((1e-06 < ABS(*(double *)(local_830 + 10) - wcs->xinc) ||
                  (1e-06 < ABS(*(double *)(local_830 + 0xc) - wcs->yinc))))))) ||
               (1e-06 < ABS(*(double *)(local_830 + 0xe) - wcs->rot))) ||
              (iVar2 = strcmp((char *)(local_830 + 0x10),wcs->type), iVar2 == 0)))) {
            tstatus = 1;
          }
        }
        for (icol[5] = 0; icol[5] < 6; icol[5] = icol[5] + 1) {
          iVar2 = ffgtdm(fptr,(&anynul)[icol[5]],1,&npos,icsize + (long)icol[5] + -1,status);
          if (iVar2 != 0) {
            ffpmsg("Could not find vector size of column.");
            goto LAB_0027a307;
          }
        }
        cvalue2 = (char *)malloc(0x48);
        for (icol[5] = 1; icol[5] <= Rgn_00->nShapes; icol[5] = icol[5] + 1) {
          pRVar3 = Rgn_00->Shapes + (icol[5] + -1);
          for (icol[4] = 0; icol[4] < 8; icol[4] = icol[4] + 1) {
            *(undefined8 *)((long)&pRVar3->param + (long)icol[4] * 8) = 0;
          }
          (pRVar3->param).gen.a = 0.0;
          (pRVar3->param).gen.b = 0.0;
          (pRVar3->param).gen.sinT = 0.0;
          (pRVar3->param).gen.cosT = 0.0;
          iVar2 = ffgcvs(fptr,icol[0],(long)icol[5],1,1," ",&cvalue2,&dotransform,status);
          unique0x100012e5 = cvalue2;
          if (iVar2 != 0) {
            ffpmsg("Could not read shape.");
            break;
          }
          pRVar3->sign = '\x01';
          iVar2 = strncmp(cvalue2,"!",1);
          if (iVar2 == 0) {
            pRVar3->sign = '\0';
            register0x00000000 = unique0x100012e5 + 1;
          }
          for (icol[4] = 0; icol[4] < 0x11; icol[4] = icol[4] + 1) {
            iVar2 = strcmp(stack0xfffffffffffffef8,shapename[(long)icol[4] + -1] + 0x3f);
            if (iVar2 == 0) {
              pRVar3->shape = shapetype[(long)icol[4] + -2];
            }
          }
          if (pRVar3->shape == poly_rgn) {
            pdVar4 = (double *)calloc((long)X << 1,8);
            (pRVar3->param).poly.Pts = pdVar4;
            if ((pRVar3->param).poly.Pts == (double *)0x0) {
              ffpmsg("Could not allocate memory to hold polygon parameters");
              *status = 0x71;
              break;
            }
            (pRVar3->param).poly.nPts = (int)((long)X << 1);
            cvalue = (char *)(pRVar3->param).poly.Pts;
          }
          else {
            cvalue = (char *)&pRVar3->param;
          }
          got_component = 1;
          if (pRVar3->shape == poly_rgn) {
            got_component = (pRVar3->param).poly.nPts / 2;
          }
          if (pRVar3->shape == rectangle_rgn) {
            got_component = 2;
          }
          for (icol[4] = 0; icol[4] < got_component; icol[4] = icol[4] + 1) {
            iVar2 = ffgcvd(fptr,anynul,(long)icol[5],(long)(icol[4] + 1),1,-9.1191291391491e-36,
                           (double *)cvalue,&dotransform,status);
            if (iVar2 != 0) {
              ffpmsg("Failed to read X column for polygon region");
              goto LAB_0027a307;
            }
            if ((*(double *)cvalue == -9.1191291391491e-36) && (!NAN(*(double *)cvalue))) {
              got_component = icol[4];
              (pRVar3->param).poly.nPts = icol[4] << 1;
              break;
            }
            cvalue = cvalue + 8;
            iVar2 = ffgcvd(fptr,idum,(long)icol[5],(long)(icol[4] + 1),1,-9.1191291391491e-36,
                           (double *)cvalue,&dotransform,status);
            if (iVar2 != 0) {
              ffpmsg("Failed to read Y column for polygon region");
              goto LAB_0027a307;
            }
            if ((*(double *)cvalue == -9.1191291391491e-36) && (!NAN(*(double *)cvalue))) {
              got_component = icol[4];
              (pRVar3->param).poly.nPts = icol[4] << 1;
              cvalue = cvalue + -8;
              break;
            }
            if (icol[4] == 0) {
              Ysave = *(double *)(cvalue + -8);
              Xpos = *(double *)cvalue;
            }
            else if ((Ysave == *(double *)(cvalue + -8)) &&
                    (!NAN(Ysave) && !NAN(*(double *)(cvalue + -8)))) {
              if ((Xpos == *(double *)cvalue) && (!NAN(Xpos) && !NAN(*(double *)cvalue))) {
                got_component = icol[4] + 1;
                (pRVar3->param).poly.nPts = got_component * 2;
                cvalue = cvalue + 8;
                break;
              }
            }
            cvalue = cvalue + 8;
          }
          if (tstatus != 0) {
            cvalue = cvalue + (long)(got_component << 1) * -8;
            Ysave = *(double *)cvalue;
            Xpos = *(double *)((long)cvalue + 8);
            for (icol[4] = 0; icol[4] < got_component; icol[4] = icol[4] + 1) {
              ffwldp(*(double *)(cvalue + (long)(icol[4] << 1) * 8),
                     *(double *)(cvalue + (long)(icol[4] * 2 + 1) * 8),*(double *)(local_830 + 2),
                     *(double *)(local_830 + 4),*(double *)(local_830 + 6),
                     *(double *)(local_830 + 8),*(double *)(local_830 + 10),
                     *(double *)(local_830 + 0xc),*(double *)(local_830 + 0xe),
                     (char *)(local_830 + 0x10),&Ypos,(double *)&coords,status);
              ffxypx(Ypos,(double)coords,wcs->xrefval,wcs->yrefval,wcs->xrefpix,wcs->yrefpix,
                     wcs->xinc,wcs->yinc,wcs->rot,wcs->type,
                     (double *)(cvalue + (long)(icol[4] << 1) * 8),
                     (double *)(cvalue + (long)(icol[4] * 2 + 1) * 8),status);
              if (*status != 0) {
                ffpmsg("Failed to transform coordinates");
                goto LAB_0027a307;
              }
            }
            cvalue = cvalue + (long)(got_component << 1) * 8;
          }
          got_component = 0;
          sVar1 = pRVar3->shape;
          if (sVar1 == circle_rgn) {
            got_component = 1;
          }
          else {
            if (1 < sVar1 - annulus_rgn) {
              if (sVar1 == elliptannulus_rgn) {
LAB_00279ec8:
                got_component = 4;
                goto LAB_00279ed3;
              }
              if (sVar1 != box_rgn) {
                if (sVar1 == boxannulus_rgn) goto LAB_00279ec8;
                if (1 < sVar1 - diamond_rgn) goto LAB_00279ed3;
              }
            }
            got_component = 2;
          }
LAB_00279ed3:
          if (got_component != 0) {
            iVar2 = ffgcvd(fptr,icol[1],(long)icol[5],1,(long)got_component,0.0,(double *)cvalue,
                           &dotransform,status);
            if (iVar2 != 0) {
              ffpmsg("Failed to read R column for region");
              break;
            }
            if (tstatus == 0) {
              cvalue = cvalue + (long)got_component * 8;
            }
            else {
              for (icol[4] = 0; icol[4] < got_component; icol[4] = icol[4] + 1) {
                Theta = Xpos + *(double *)cvalue;
                Y = Ysave;
                ffwldp(Ysave,Theta,*(double *)(local_830 + 2),*(double *)(local_830 + 4),
                       *(double *)(local_830 + 6),*(double *)(local_830 + 8),
                       *(double *)(local_830 + 10),*(double *)(local_830 + 0xc),
                       *(double *)(local_830 + 0xe),(char *)(local_830 + 0x10),&Ypos,
                       (double *)&coords,status);
                ffxypx(Ypos,(double)coords,wcs->xrefval,wcs->yrefval,wcs->xrefpix,wcs->yrefpix,
                       wcs->xinc,wcs->yinc,wcs->rot,wcs->type,&Y,&Theta,status);
                if (*status != 0) {
                  ffpmsg("Failed to transform coordinates");
                  goto LAB_0027a307;
                }
                dVar5 = pow(Y - (pRVar3->param).gen.p[0],2.0);
                dVar6 = pow(Theta - (pRVar3->param).gen.p[1],2.0);
                dVar5 = sqrt(dVar5 + dVar6);
                *(double *)cvalue = dVar5;
                cvalue = cvalue + 8;
              }
            }
          }
          got_component = 0;
          sVar1 = pRVar3->shape;
          if (sVar1 == ellipse_rgn) {
LAB_0027a18e:
            got_component = 1;
          }
          else if (sVar1 == elliptannulus_rgn) {
LAB_0027a197:
            got_component = 2;
          }
          else {
            if (sVar1 == box_rgn) goto LAB_0027a18e;
            if (sVar1 == boxannulus_rgn) goto LAB_0027a197;
            if (sVar1 == diamond_rgn) goto LAB_0027a18e;
            if (sVar1 == sector_rgn) goto LAB_0027a197;
          }
          if (got_component != 0) {
            iVar2 = ffgcvd(fptr,icol[2],(long)icol[5],1,(long)got_component,0.0,(double *)cvalue,
                           &dotransform,status);
            if (iVar2 != 0) {
              ffpmsg("Failed to read ROTANG column for region");
              break;
            }
            if (tstatus == 0) {
              cvalue = cvalue + (long)got_component * 8;
            }
            else {
              Xsave = wcs->rot - *(double *)(local_830 + 0xe);
              for (icol[4] = 0; icol[4] < got_component; icol[4] = icol[4] + 1) {
                *(double *)cvalue = Xsave + *(double *)cvalue;
                cvalue = cvalue + 8;
              }
            }
          }
          if (local_7c == 0) {
            pRVar3->comp = 1;
          }
          else {
            iVar2 = ffgcv(fptr,0x1f,icol[3],(long)icol[5],1,1,(void *)0x0,&pRVar3->comp,&dotransform
                          ,status);
            if (iVar2 != 0) {
              ffpmsg("Failed to read COMPONENT column for region");
              break;
            }
          }
          fits_setup_shape(pRVar3);
        }
      }
    }
    else {
      ffpmsg("Could not read NAXIS2 keyword.");
    }
  }
  else {
    ffpmsg("Could not move to REGION extension.");
  }
LAB_0027a307:
  if (*status == 0) {
    *Rgn = Rgn_00;
  }
  else {
    fits_free_region(Rgn_00);
  }
  ffclos(fptr,status);
  return *status;
}

Assistant:

int fits_read_fits_region ( fitsfile *fptr, 
			    WCSdata *wcs, 
			    SAORegion **Rgn, 
			    int *status)
/*  Read regions from a FITS region extension and return the information     */
/*  in the "SAORegion" structure.  If it is nonNULL, use wcs to convert the  */
/*  region coordinates to pixels.  Return an error if region is in degrees   */
/*  but no WCS data is provided.                                             */
/*---------------------------------------------------------------------------*/
{

  int i, j, icol[6], idum, anynul, npos;
  int dotransform, got_component = 1, tstatus;
  long icsize[6];
  double X, Y, Theta, Xsave = 0, Ysave = 0, Xpos, Ypos;
  double *coords;
  char *cvalue, *cvalue2;
  char comment[FLEN_COMMENT];
  char colname[6][FLEN_VALUE] = {"X", "Y", "SHAPE", "R", "ROTANG", "COMPONENT"};
  char shapename[17][FLEN_VALUE] = {"POINT","CIRCLE","ELLIPSE","ANNULUS",
				    "ELLIPTANNULUS","BOX","ROTBOX","BOXANNULUS",
				    "RECTANGLE","ROTRECTANGLE","POLYGON","PIE",
				    "SECTOR","DIAMOND","RHOMBUS","ROTDIAMOND",
				    "ROTRHOMBUS"};
  int shapetype[17] = {point_rgn, circle_rgn, ellipse_rgn, annulus_rgn, 
		       elliptannulus_rgn, box_rgn, box_rgn, boxannulus_rgn, 
		       rectangle_rgn, rectangle_rgn, poly_rgn, sector_rgn, 
		       sector_rgn, diamond_rgn, diamond_rgn, diamond_rgn, 
		       diamond_rgn};
  SAORegion *aRgn;
  RgnShape *newShape;
  WCSdata *regwcs = 0;

  if ( *status ) return( *status );

  aRgn = (SAORegion *)malloc( sizeof(SAORegion) );
  if( ! aRgn ) {
    ffpmsg("Couldn't allocate memory to hold Region file contents.");
    return(*status = MEMORY_ALLOCATION );
  }
  aRgn->nShapes    =    0;
  aRgn->Shapes     = NULL;
  if( wcs && wcs->exists )
    aRgn->wcs = *wcs;
  else
    aRgn->wcs.exists = 0;

  /* See if we are already positioned to a region extension, else */
  /* move to the REGION extension (file is already open). */

  tstatus = 0;
  for (i=0; i<5; i++) {
    ffgcno(fptr, CASEINSEN, colname[i], &icol[i], &tstatus);
  }

  if (tstatus) {
    /* couldn't find the required columns, so search for "REGION" extension */
    if ( ffmnhd(fptr, BINARY_TBL, "REGION", 1, status) ) {
      ffpmsg("Could not move to REGION extension.");
      goto error;
    }
  }

  /* get the number of shapes and allocate memory */

  if ( ffgky(fptr, TINT, "NAXIS2", &aRgn->nShapes, comment, status) ) {
    ffpmsg("Could not read NAXIS2 keyword.");
    goto error;
  }

  aRgn->Shapes = (RgnShape *) malloc(aRgn->nShapes * sizeof(RgnShape));
  if ( !aRgn->Shapes ) {
    ffpmsg( "Failed to allocate memory for Region data");
    *status = MEMORY_ALLOCATION;
    goto error;
  }

  /* get the required column numbers */

  for (i=0; i<5; i++) {
    if ( ffgcno(fptr, CASEINSEN, colname[i], &icol[i], status) ) {
      ffpmsg("Could not find column.");
      goto error;
    }
  }

  /* try to get the optional column numbers */

  if ( ffgcno(fptr, CASEINSEN, colname[5], &icol[5], status) ) {
       got_component = 0;
  }

  /* if there was input WCS then read the WCS info for the region in case they */
  /* are different and we have to transform */

  dotransform = 0;
  if ( aRgn->wcs.exists ) {
    regwcs = (WCSdata *) malloc ( sizeof(WCSdata) );
    if ( !regwcs ) {
      ffpmsg( "Failed to allocate memory for Region WCS data");
      *status = MEMORY_ALLOCATION;
      goto error;
    }

    regwcs->exists = 1;
    if ( ffgtcs(fptr, icol[0], icol[1], &regwcs->xrefval,  &regwcs->yrefval,
		&regwcs->xrefpix, &regwcs->yrefpix, &regwcs->xinc, &regwcs->yinc,
		&regwcs->rot, regwcs->type, status) ) {
      regwcs->exists = 0;
      *status = 0;
    }

    if ( regwcs->exists && wcs->exists ) {
      if ( fabs(regwcs->xrefval-wcs->xrefval) > 1.0e-6 ||
	   fabs(regwcs->yrefval-wcs->yrefval) > 1.0e-6 ||
	   fabs(regwcs->xrefpix-wcs->xrefpix) > 1.0e-6 ||
	   fabs(regwcs->yrefpix-wcs->yrefpix) > 1.0e-6 ||
	   fabs(regwcs->xinc-wcs->xinc) > 1.0e-6 ||
	   fabs(regwcs->yinc-wcs->yinc) > 1.0e-6 ||
	   fabs(regwcs->rot-wcs->rot) > 1.0e-6 ||
	   !strcmp(regwcs->type,wcs->type) ) dotransform = 1;
    }
  }

  /* get the sizes of the X, Y, R, and ROTANG vectors */

  for (i=0; i<6; i++) {
    if ( ffgtdm(fptr, icol[i], 1, &idum, &icsize[i], status) ) {
      ffpmsg("Could not find vector size of column.");
      goto error;
    }
  }

  cvalue = (char *) malloc ((FLEN_VALUE+1)*sizeof(char));

  /* loop over the shapes - note 1-based counting for rows in FITS files */

  for (i=1; i<=aRgn->nShapes; i++) {

    newShape = &aRgn->Shapes[i-1];
    for (j=0; j<8; j++) newShape->param.gen.p[j] = 0.0;
    newShape->param.gen.a = 0.0;
    newShape->param.gen.b = 0.0;
    newShape->param.gen.sinT = 0.0;
    newShape->param.gen.cosT = 0.0;

    /* get the shape */

    if ( ffgcvs(fptr, icol[2], i, 1, 1, " ", &cvalue, &anynul, status) ) {
      ffpmsg("Could not read shape.");
      goto error;
    }

    /* set include or exclude */

    newShape->sign = 1;
    cvalue2 = cvalue;
    if ( !strncmp(cvalue,"!",1) ) {
      newShape->sign = 0;
      cvalue2++;
    }

    /* set the shape type */

    for (j=0; j<17; j++) {
      if ( !strcmp(cvalue2, shapename[j]) ) newShape->shape = shapetype[j];
    }

    /* allocate memory for polygon case and set coords pointer */

    if ( newShape->shape == poly_rgn ) {
      newShape->param.poly.Pts = (double *) calloc (2*icsize[0], sizeof(double));
      if ( !newShape->param.poly.Pts ) {
	ffpmsg("Could not allocate memory to hold polygon parameters" );
	*status = MEMORY_ALLOCATION;
	goto error;
      }
      newShape->param.poly.nPts = 2*icsize[0];
      coords = newShape->param.poly.Pts;
    } else {
      coords = newShape->param.gen.p;
    }


  /* read X and Y. Polygon and Rectangle require special cases */

    npos = 1;
    if ( newShape->shape == poly_rgn ) npos = newShape->param.poly.nPts/2;
    if ( newShape->shape == rectangle_rgn ) npos = 2;

    for (j=0; j<npos; j++) {
      if ( ffgcvd(fptr, icol[0], i, j+1, 1, DOUBLENULLVALUE, coords, &anynul, status) ) {
	ffpmsg("Failed to read X column for polygon region");
	goto error;
      }
      if (*coords == DOUBLENULLVALUE) {  /* check for null value end of array marker */
        npos = j;
	newShape->param.poly.nPts = npos * 2;
	break;
      }
      coords++;
      
      if ( ffgcvd(fptr, icol[1], i, j+1, 1, DOUBLENULLVALUE, coords, &anynul, status) ) {
	ffpmsg("Failed to read Y column for polygon region");
	goto error;
      }
      if (*coords == DOUBLENULLVALUE) { /* check for null value end of array marker */
        npos = j;
	newShape->param.poly.nPts = npos * 2;
        coords--;
	break;
      }
      coords++;
 
      if (j == 0) {  /* save the first X and Y coordinate */
        Xsave = *(coords - 2);
	Ysave = *(coords - 1);
      } else if ((Xsave == *(coords - 2)) && (Ysave == *(coords - 1)) ) {
        /* if point has same coordinate as first point, this marks the end of the array */
        npos = j + 1;
	newShape->param.poly.nPts = npos * 2;
	break;
      }
    }

    /* transform positions if the region and input wcs differ */

    if ( dotransform ) {

      coords -= npos*2;
      Xsave = coords[0];
      Ysave = coords[1];
      for (j=0; j<npos; j++) {
	ffwldp(coords[2*j], coords[2*j+1], regwcs->xrefval, regwcs->yrefval, regwcs->xrefpix,
	       regwcs->yrefpix, regwcs->xinc, regwcs->yinc, regwcs->rot,
	       regwcs->type, &Xpos, &Ypos, status);
	ffxypx(Xpos, Ypos, wcs->xrefval, wcs->yrefval, wcs->xrefpix,
	       wcs->yrefpix, wcs->xinc, wcs->yinc, wcs->rot,
	       wcs->type, &coords[2*j], &coords[2*j+1], status);
	if ( *status ) {
	  ffpmsg("Failed to transform coordinates");
	  goto error;
	}
      }
      coords += npos*2;
    }

  /* read R. Circle requires one number; Box, Diamond, Ellipse, Annulus, Sector 
     and Panda two; Boxannulus and Elliptannulus four; Point, Rectangle and 
     Polygon none. */

    npos = 0;
    switch ( newShape->shape ) {
    case circle_rgn: 
      npos = 1;
      break;
    case box_rgn:
    case diamond_rgn:
    case ellipse_rgn:
    case annulus_rgn:
    case sector_rgn:
      npos = 2;
      break;
    case boxannulus_rgn:
    case elliptannulus_rgn:
      npos = 4;
      break;
    default:
      break;
    }

    if ( npos > 0 ) {
      if ( ffgcvd(fptr, icol[3], i, 1, npos, 0.0, coords, &anynul, status) ) {
	ffpmsg("Failed to read R column for region");
	goto error;
      }

    /* transform lengths if the region and input wcs differ */

      if ( dotransform ) {
	for (j=0; j<npos; j++) {
	  Y = Ysave + (*coords);
	  X = Xsave;
	  ffwldp(X, Y, regwcs->xrefval, regwcs->yrefval, regwcs->xrefpix,
		 regwcs->yrefpix, regwcs->xinc, regwcs->yinc, regwcs->rot,
		 regwcs->type, &Xpos, &Ypos, status);
	  ffxypx(Xpos, Ypos, wcs->xrefval, wcs->yrefval, wcs->xrefpix,
		 wcs->yrefpix, wcs->xinc, wcs->yinc, wcs->rot,
		 wcs->type, &X, &Y, status);
	  if ( *status ) {
	    ffpmsg("Failed to transform coordinates");
	    goto error;
	  }
	  *(coords++) = sqrt(pow(X-newShape->param.gen.p[0],2)+pow(Y-newShape->param.gen.p[1],2));
	}
      } else {
	coords += npos;
      }
    }

  /* read ROTANG. Requires two values for Boxannulus, Elliptannulus, Sector, 
     Panda; one for Box, Diamond, Ellipse; and none for Circle, Point, Annulus, 
     Rectangle, Polygon */

    npos = 0;
    switch ( newShape->shape ) {
    case box_rgn:
    case diamond_rgn:
    case ellipse_rgn:
      npos = 1;
      break;
    case boxannulus_rgn:
    case elliptannulus_rgn:
    case sector_rgn:
      npos = 2;
      break;
    default:
     break;
    }

    if ( npos > 0 ) {
      if ( ffgcvd(fptr, icol[4], i, 1, npos, 0.0, coords, &anynul, status) ) {
	ffpmsg("Failed to read ROTANG column for region");
	goto error;
      }

    /* transform angles if the region and input wcs differ */

      if ( dotransform ) {
	Theta = (wcs->rot) - (regwcs->rot);
	for (j=0; j<npos; j++) *(coords++) += Theta;
      } else {
	coords += npos;
      }
    }

  /* read the component number */

    if (got_component) {
      if ( ffgcv(fptr, TINT, icol[5], i, 1, 1, 0, &newShape->comp, &anynul, status) ) {
        ffpmsg("Failed to read COMPONENT column for region");
        goto error;
      }
    } else {
      newShape->comp = 1;
    }


    /* do some precalculations to speed up tests */

    fits_setup_shape(newShape);

    /* end loop over shapes */

  }

error:

   if( *status )
      fits_free_region( aRgn );
   else
      *Rgn = aRgn;

   ffclos(fptr, status);

   return( *status );
}